

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O1

void __thiscall
burst::
subset_iterator<std::_List_iterator<int>,_std::less<void>,_std::vector<std::_List_iterator<int>,_std::allocator<std::_List_iterator<int>_>_>_>
::subset_iterator(subset_iterator<std::_List_iterator<int>,_std::less<void>,_std::vector<std::_List_iterator<int>,_std::allocator<std::_List_iterator<int>_>_>_>
                  *this,_List_node_base *first,_List_node_base *last)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  pointer p_Var3;
  _List_node_base *p_Var4;
  __normal_iterator<std::_List_iterator<int>_*,_std::vector<std::_List_iterator<int>,_std::allocator<std::_List_iterator<int>_>_>_>
  _Var5;
  size_type __n;
  _List_node_base *p_Var6;
  allocator_type local_19;
  
  (this->m_begin)._M_node = first;
  (this->m_end)._M_node = last;
  if (first == last) {
    __n = 0;
  }
  else {
    __n = 0;
    do {
      first = first->_M_next;
      __n = __n + 1;
    } while (first != last);
  }
  std::vector<std::_List_iterator<int>,_std::allocator<std::_List_iterator<int>_>_>::vector
            (&this->m_subset,__n,&local_19);
  this->m_subset_size = 0;
  p_Var6 = (this->m_begin)._M_node;
  p_Var2 = (this->m_end)._M_node;
  p_Var4 = p_Var2;
  if (p_Var6 != p_Var2) {
    do {
      p_Var4 = p_Var6->_M_next;
      if (p_Var4 == p_Var2) break;
      p_Var1 = p_Var6 + 1;
      p_Var6 = p_Var4;
    } while (*(int *)&p_Var1->_M_next <= *(int *)&p_Var4[1]._M_next);
  }
  if (p_Var4 != p_Var2) {
    __assert_fail("std::is_sorted(m_begin, m_end, m_compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subset_iterator.hpp"
                  ,0x5d,
                  "burst::subset_iterator<std::_List_iterator<int>>::subset_iterator(ForwardIterator, ForwardIterator, compare_type) [ForwardIterator = std::_List_iterator<int>, Compare = std::less<void>, SubsetContainer = std::vector<std::_List_iterator<int>>]"
                 );
  }
  p_Var3 = (this->m_subset).
           super__Vector_base<std::_List_iterator<int>,_std::allocator<std::_List_iterator<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  _Var5 = next_subset<__gnu_cxx::__normal_iterator<std::_List_iterator<int>*,std::vector<std::_List_iterator<int>,std::allocator<std::_List_iterator<int>>>>,std::_List_iterator<int>,std::less<void>>
                    (p_Var3,p_Var3);
  this->m_subset_size =
       (long)_Var5._M_current -
       (long)(this->m_subset).
             super__Vector_base<std::_List_iterator<int>,_std::allocator<std::_List_iterator<int>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  return;
}

Assistant:

explicit subset_iterator
            (
                ForwardIterator first, ForwardIterator last,
                compare_type compare = compare_type{}
            ):
            m_begin(std::move(first)),
            m_end(std::move(last)),
            m_subset(static_cast<std::size_t>(std::distance(m_begin, m_end))),
            m_subset_size(0),
            m_compare(compare)
        {
            BOOST_ASSERT(std::is_sorted(m_begin, m_end, m_compare));
            increment();
        }